

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O2

void crnlib::MatchFinder_SetLimits(CMatchFinder *p)

{
  uint uVar1;
  UInt32 lenLimit;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = p->pos;
  uVar4 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (~uVar1 <= uVar4) {
    uVar4 = ~uVar1;
  }
  uVar2 = p->streamPos - uVar1;
  uVar5 = uVar2 - p->keepSizeAfter;
  uVar3 = (uint)(uVar2 != 0);
  if (p->keepSizeAfter <= uVar2 && uVar5 != 0) {
    uVar3 = uVar5;
  }
  if (uVar4 <= uVar3) {
    uVar3 = uVar4;
  }
  if (p->matchMaxLen <= uVar2) {
    uVar2 = p->matchMaxLen;
  }
  p->lenLimit = uVar2;
  p->posLimit = uVar3 + uVar1;
  return;
}

Assistant:

static void MatchFinder_SetLimits(CMatchFinder* p) {
  UInt32 limit = kMaxValForNormalize - p->pos;
  UInt32 limit2 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (limit2 < limit)
    limit = limit2;
  limit2 = p->streamPos - p->pos;
  if (limit2 <= p->keepSizeAfter) {
    if (limit2 > 0)
      limit2 = 1;
  } else
    limit2 -= p->keepSizeAfter;
  if (limit2 < limit)
    limit = limit2;
  {
    UInt32 lenLimit = p->streamPos - p->pos;
    if (lenLimit > p->matchMaxLen)
      lenLimit = p->matchMaxLen;
    p->lenLimit = lenLimit;
  }
  p->posLimit = p->pos + limit;
}